

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcObjTemplate * __thiscall
CTcParser::find_class_template
          (CTcParser *this,CTPNSuperclass *first_sc,CTcObjTemplateInst *src,size_t src_cnt,
          CTPNSuperclass **def_sc,int *undesc_class)

{
  CTcParser *pCVar1;
  tc_symtype_t tVar2;
  tc_metaclass_t tVar3;
  int iVar4;
  CTcPrsSymtab *sym;
  CTcPrsSymtab *this_00;
  CTcSymObjBase *this_01;
  CTPNSuperclass *pCVar5;
  CTcObjTemplateInst *in_RCX;
  CTPNSuperclass *in_RDX;
  CTcParser *in_RSI;
  CTcParser *in_RDI;
  undefined8 *in_R8;
  CTPNSuperclass **in_R9;
  CTPNSuperclass *cur_def_sc;
  CTcObjTemplate *cur_tpl;
  CTcSymObj *sc_sym;
  CTcObjTemplate *tpl;
  CTPNSuperclass *sc;
  CTcParser *in_stack_ffffffffffffffa0;
  CTcParser *in_stack_ffffffffffffffa8;
  CTcParser *local_48;
  CTcParser *this_02;
  
  local_48 = (CTcParser *)0x0;
  this_02 = in_RSI;
  while( true ) {
    if (in_RSI == (CTcParser *)0x0) {
      return (CTcObjTemplate *)local_48;
    }
    sym = get_global_symtab(in_RDI);
    this_00 = (CTcPrsSymtab *)CTPNSuperclass::get_sym_txt((CTPNSuperclass *)in_RSI);
    CTPNSuperclass::get_sym_len((CTPNSuperclass *)in_RSI);
    this_01 = (CTcSymObjBase *)CTcPrsSymtab::find(this_00,(textchar_t *)sym,0x26c713);
    if (((this_01 == (CTcSymObjBase *)0x0) ||
        (tVar2 = CTcSymbolBase::get_type((CTcSymbolBase *)this_01), tVar2 != TC_SYM_OBJ)) ||
       (tVar3 = CTcSymObjBase::get_metaclass(this_01), tVar3 != TC_META_TADSOBJ)) break;
    CTcSymObjBase::get_first_template(this_01);
    in_stack_ffffffffffffffa8 =
         (CTcParser *)
         find_template_match(in_stack_ffffffffffffffa8,(CTcObjTemplate *)in_stack_ffffffffffffffa0,
                             (CTcObjTemplateInst *)in_RDI,(size_t)this_00);
    pCVar1 = in_RSI;
    if (in_stack_ffffffffffffffa8 == (CTcParser *)0x0) {
      pCVar5 = CTcSymObjBase::get_sc_name_head(this_01);
      if ((pCVar5 == (CTPNSuperclass *)0x0) &&
         (iVar4 = CTcSymObjBase::sc_is_root(this_01), iVar4 == 0)) {
        *(int *)in_R9 = 1;
        return (CTcObjTemplate *)0x0;
      }
      CTcSymObjBase::get_sc_name_head(this_01);
      in_stack_ffffffffffffffa8 =
           (CTcParser *)find_class_template(this_02,in_RDX,in_RCX,(size_t)in_R8,in_R9,(int *)in_RSI)
      ;
      pCVar1 = in_stack_ffffffffffffffa0;
      if (*(int *)in_R9 != 0) {
        return (CTcObjTemplate *)0x0;
      }
    }
    in_stack_ffffffffffffffa0 = pCVar1;
    if (in_stack_ffffffffffffffa8 != (CTcParser *)0x0) {
      if (local_48 == (CTcParser *)0x0) {
        *in_R8 = in_stack_ffffffffffffffa0;
        local_48 = in_stack_ffffffffffffffa8;
      }
      else {
        iVar4 = CTPNSuperclass::is_subclass_of
                          ((CTPNSuperclass *)in_stack_ffffffffffffffa8,
                           (CTPNSuperclass *)in_stack_ffffffffffffffa0);
        if (iVar4 != 0) {
          *in_R8 = in_stack_ffffffffffffffa0;
          local_48 = in_stack_ffffffffffffffa8;
        }
      }
    }
    in_RSI = (CTcParser *)in_RSI->ov_op_sub_;
  }
  return (CTcObjTemplate *)0x0;
}

Assistant:

const CTcObjTemplate *CTcParser::
   find_class_template(const CTPNSuperclass *first_sc,
                       CTcObjTemplateInst *src, size_t src_cnt,
                       const CTPNSuperclass **def_sc,
                       int *undesc_class)
{
    /* scan each superclass in the list for a match */
    const CTPNSuperclass *sc;
    const CTcObjTemplate *tpl;
    for (tpl = 0, sc = first_sc ; sc != 0 ; sc = sc->nxt_)
    {
        /* find the symbol for this superclass */
        CTcSymObj *sc_sym = (CTcSymObj *)get_global_symtab()->find(
            sc->get_sym_txt(), sc->get_sym_len());

        /* if there's no symbol, or it's not a tads-object, give up */
        if (sc_sym == 0
            || sc_sym->get_type() != TC_SYM_OBJ
            || sc_sym->get_metaclass() != TC_META_TADSOBJ)
        {
            /* 
             *   this class has an invalid superclass - just give up without
             *   issuing any errors now, since we'll have plenty to say
             *   about this when building the object file data 
             */
            return 0;
        }

        /* find a match in this superclass hierarchy */
        const CTcObjTemplate *cur_tpl = find_template_match(
            sc_sym->get_first_template(), src, src_cnt);

        /* see what we found */
        const CTPNSuperclass *cur_def_sc;
        if (cur_tpl != 0)
        {
            /* we found it - note the current defining superclass */
            cur_def_sc = sc;
        }
        else
        {
            /* 
             *   If this one has no superclass list, and it's not explicitly
             *   a subclass of the root class, then this is an undescribed
             *   class and cannot be used with templates at all.  A class is
             *   undescribed when it is explicitly declared as 'extern', and
             *   does not have a definition in any imported symbol file in
             *   the current compilation.  If this is the case, flag it so
             *   the caller will know we have an undescribed class.
             *   
             *   Note that we only set this flag if we failed to find a
             *   template.  A template can still be used if a matching
             *   template is explicitly defined on the class in this
             *   compilation unit, since in that case we don't need to look
             *   up the inheritance hierarchy for the class.  That's why we
             *   set the flag here, only after we have failed to find a
             *   template for the object.  
             */
            if (sc_sym->get_sc_name_head() == 0 && !sc_sym->sc_is_root())
            {
                /* tell the caller we have an undescribed class */
                *undesc_class = TRUE;

                /* 
                 *   there's no need to look any further, since any matches
                 *   we might find among our other superclasses would be in
                 *   doubt because of the lack of information about this
                 *   earlier class, which might override later superclasses
                 *   if we knew more about it 
                 */
                return 0;
            }

            /* we didn't find it - search superclasses of this class */
            cur_tpl = find_class_template(sc_sym->get_sc_name_head(),
                                          src, src_cnt, &cur_def_sc,
                                          undesc_class);

            /* 
             *   if we have an undescribed class among our superclasses,
             *   we're implicitly undescribed as well - if that's the case,
             *   there's no need to look any further, so return failure 
             */
            if (*undesc_class)
                return 0;
        }

        /* if we found a match, see if we want to keep it */
        if (cur_tpl != 0)
        {
            /* 
             *   if this is our first match, note it; if it's not, see if it
             *   overrides the previous match 
             */
            if (tpl == 0)
            {
                /* this is the first match - definitely keep it */
                tpl = cur_tpl;
                *def_sc = cur_def_sc;
            }
            else
            {
                /* 
                 *   if the current source object descends from the previous
                 *   source object, this definition overrides the previous
                 *   definition, so keep it rather than the last one 
                 */
                if (cur_def_sc->is_subclass_of(*def_sc))
                {
                    /* it overrides the previous one - keep the new one */
                    tpl = cur_tpl;
                    *def_sc = cur_def_sc;
                }
            }
        }
    }

    /* return the best match we found */
    return tpl;
}